

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alListener3i(ALenum param,ALint value1,ALint value2,ALint value3)

{
  ALint value3_local;
  ALint value2_local;
  ALint value1_local;
  ALenum param_local;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alListener3i);
  IO_ENUM(param);
  IO_INT32(value1);
  IO_INT32(value2);
  IO_INT32(value3);
  (*REAL_alListener3i)(param,value1,value2,value3);
  check_listener_state();
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alListener3i(ALenum param, ALint value1, ALint value2, ALint value3)
{
    IO_START(alListener3i);
    IO_ENUM(param);
    IO_INT32(value1);
    IO_INT32(value2);
    IO_INT32(value3);
    REAL_alListener3i(param, value1, value2, value3);
    check_listener_state();
    IO_END();
}